

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_integerwidth.cpp
# Opt level: O2

IntegerWidth __thiscall icu_63::number::IntegerWidth::truncateAt(IntegerWidth *this,int32_t maxInt)

{
  ushort uVar1;
  anon_union_8_2_136a0349_for_fUnion aVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined8 in_RDX;
  ulong uVar5;
  IntegerWidth IVar6;
  
  uVar4 = (undefined4)CONCAT71((int7)((ulong)in_RDX >> 8),this->fHasError);
  if (this->fHasError == true) {
    aVar2 = this->fUnion;
    maxInt = aVar2._2_4_;
    uVar3 = aVar2.field2 & 0xffffff0000000000;
    uVar5 = aVar2.field2 & 0xff00000000;
  }
  else {
    uVar1 = (this->fUnion).minMaxInt.fMinInt;
    aVar2._2_6_ = 0;
    aVar2.minMaxInt.fMinInt = uVar1;
    if (maxInt < (short)uVar1 || 999 < (uint)maxInt) {
      if (maxInt != -1) {
        uVar4 = (undefined4)CONCAT71((uint7)(uint3)(int3)(char)(uVar1 >> 8),1);
        aVar2 = (anon_union_8_2_136a0349_for_fUnion)0x112;
        maxInt = 1;
        uVar3 = 0;
        uVar5 = 0;
        goto LAB_0029a282;
      }
      maxInt = 0xffff;
    }
    uVar3 = 0;
    uVar5 = 0;
    uVar4 = 0;
  }
LAB_0029a282:
  IVar6.fUnion.field2 = (ulong)(uint)(aVar2.errorCode & 0xffff | maxInt << 0x10) | uVar3 | uVar5;
  IVar6._8_4_ = uVar4;
  return IVar6;
}

Assistant:

IntegerWidth IntegerWidth::truncateAt(int32_t maxInt) {
    if (fHasError) { return *this; }  // No-op on error
    digits_t minInt = fUnion.minMaxInt.fMinInt;
    if (maxInt >= 0 && maxInt <= kMaxIntFracSig && minInt <= maxInt) {
        return {minInt, static_cast<digits_t>(maxInt), false};
    } else if (maxInt == -1) {
        return {minInt, -1, false};
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}